

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

void chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name)

{
  bool bVar1;
  size_type sVar2;
  reserved_word_error *this;
  illegal_name_error *this_00;
  string local_30;
  
  bVar1 = is_reserved_word<std::__cxx11::string>(name);
  if (bVar1) {
    this = (reserved_word_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_30,name);
    exception::reserved_word_error::reserved_word_error(this,&local_30);
    __cxa_throw(this,&exception::reserved_word_error::typeinfo,
                exception::reserved_word_error::~reserved_word_error);
  }
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (name,"::",0);
  if (sVar2 == 0xffffffffffffffff) {
    return;
  }
  this_00 = (illegal_name_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_30,name);
  exception::illegal_name_error::illegal_name_error(this_00,&local_30);
  __cxa_throw(this_00,&exception::illegal_name_error::typeinfo,
              exception::illegal_name_error::~illegal_name_error);
}

Assistant:

static void validate_object_name(const T &name) {
      if (is_reserved_word(name)) {
        throw exception::reserved_word_error(std::string(name));
      }

      if (name.find("::") != std::string::npos) {
        throw exception::illegal_name_error(std::string(name));
      }
    }